

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

int __thiscall zmq::detail::socket_base::get<8,int,false>(socket_base *this)

{
  int val;
  size_t size;
  
  size = 4;
  get_option(this,8,&val,&size);
  if (size == 4) {
    return val;
  }
  __assert_fail("size == sizeof val",
                "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",0x72c,
                "T zmq::detail::socket_base::get(sockopt::integral_option<Opt, T, BoolUnit>) const [Opt = 8, T = int, BoolUnit = false]"
               );
}

Assistant:

ZMQ_NODISCARD T get(sockopt::integral_option<Opt, T, BoolUnit>) const
    {
        static_assert(std::is_scalar<T>::value, "T must be scalar");
        T val;
        size_t size = sizeof val;
        get_option(Opt, &val, &size);
        assert(size == sizeof val);
        return val;
    }